

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binomial.h
# Opt level: O1

void __thiscall CBinomialHeap::InsertList(CBinomialHeap *this,CBinomialNode **otherRoot)

{
  int iVar1;
  CBinomialNode *pCVar2;
  CBinomialNode **ppCVar3;
  CBinomialNode *pCVar4;
  CBinomialNode *pCVar5;
  CBinomialNode *pCVar6;
  bool bVar7;
  bool bVar8;
  
  pCVar2 = *otherRoot;
  bVar7 = this->root_ != (CBinomialNode *)0x0;
  bVar8 = pCVar2 != (CBinomialNode *)0x0;
  if (bVar7 && bVar8) {
    pCVar5 = (CBinomialNode *)0x0;
    pCVar6 = this->root_;
    do {
      iVar1 = pCVar6->degree_;
      pCVar4 = pCVar2;
      while (pCVar2 = pCVar4, pCVar2->degree_ < iVar1) {
        ppCVar3 = &pCVar5->next_;
        if (pCVar5 == (CBinomialNode *)0x0) {
          ppCVar3 = &this->root_;
        }
        *ppCVar3 = pCVar2;
        pCVar4 = pCVar2->next_;
        pCVar2->next_ = pCVar6;
        bVar8 = pCVar4 != (CBinomialNode *)0x0;
        pCVar5 = pCVar2;
        if (!(bool)(bVar7 & bVar8)) goto LAB_0010b4e8;
      }
      bVar8 = pCVar2 != (CBinomialNode *)0x0;
      bVar7 = pCVar6->next_ != (CBinomialNode *)0x0;
      pCVar4 = pCVar2;
      pCVar5 = pCVar6;
    } while ((bVar7) && (pCVar6 = pCVar6->next_, pCVar2 != (CBinomialNode *)0x0));
  }
  else {
    pCVar4 = pCVar2;
    pCVar5 = (CBinomialNode *)0x0;
  }
LAB_0010b4e8:
  if (bVar8) {
    pCVar5->next_ = pCVar4;
  }
  return;
}

Assistant:

void InsertList(CBinomialNode*& otherRoot) {

        CBinomialNode *lefter = nullptr, *iter1 = root_, *iter2 = otherRoot, *temp;

        while (iter1 && iter2) {
            if (iter1->degree_ <= iter2->degree_) {
                lefter = iter1;
                iter1 = iter1->next_;
                continue;
            }
            if (lefter)
                lefter->next_ = iter2;
            else
                root_ = iter2;
            temp = iter2->next_;
            iter2->next_ = iter1;
            lefter = iter2;
            iter2 = temp;
        }

        if (iter2) {
            lefter->next_ = iter2;
        }
    }